

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_Message_Test::TestBody
          (MessageDifferencerTest_IgnoreField_Message_Test *this)

{
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>_> *pVVar1;
  FieldDescriptor *field;
  TestDiffMessage msg1;
  TestDiffMessage msg2;
  MessageDifferencer differencer;
  allocator<char> local_349;
  string local_348;
  undefined1 local_328 [184];
  undefined1 local_270 [184];
  MessageDifferencer local_1b8;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_328);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_270);
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     ((RepeatedPtrFieldBase *)(local_328 + 0x70));
  (pVVar1->field_0)._impl_.c_ = 3;
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 2;
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     ((RepeatedPtrFieldBase *)(local_270 + 0x70));
  (pVVar1->field_0)._impl_.c_ = 4;
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 2;
  util::MessageDifferencer::MessageDifferencer(&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"rm",&local_349);
  field = GetFieldDescriptor((Message *)local_328,&local_348);
  util::MessageDifferencer::IgnoreField(&local_1b8,field);
  std::__cxx11::string::~string((string *)&local_348);
  ExpectEqualsWithDifferencer(&local_1b8,(Message *)local_328,(Message *)local_270);
  util::MessageDifferencer::~MessageDifferencer(&local_1b8);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_270);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_328);
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_Message) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  proto2_unittest::TestField* field;

  field = msg1.add_rm();
  field->set_c(3);

  field = msg2.add_rm();
  field->set_c(4);

  util::MessageDifferencer differencer;
  differencer.IgnoreField(GetFieldDescriptor(msg1, "rm"));

  ExpectEqualsWithDifferencer(&differencer, msg1, msg2);
}